

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptor::CopyTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  int32 iVar1;
  string *psVar2;
  long lVar3;
  FieldOptions *pFVar4;
  FieldOptions *pFVar5;
  string sStack_38;
  
  FieldDescriptorProto::set_name(proto,*(string **)this);
  iVar1 = *(int32 *)(this + 0x28);
  proto->_has_bits_[0] = proto->_has_bits_[0] | 2;
  proto->number_ = iVar1;
  FieldDescriptorProto::set_label(proto,*(FieldDescriptorProto_Label *)(this + 0x30));
  FieldDescriptorProto::set_type(proto,*(FieldDescriptorProto_Type *)(this + 0x2c));
  if (this[0x34] == (FieldDescriptor)0x1) {
    if (*(char *)(*(long *)(this + 0x38) + 0x29) == '\0') {
      FieldDescriptorProto::set_extendee(proto,".");
    }
    psVar2 = FieldDescriptorProto::mutable_extendee_abi_cxx11_(proto);
    std::__cxx11::string::append((string *)psVar2);
  }
  if (*(int *)(kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x2c) * 4) == 8) {
    lVar3 = *(long *)(this + 0x50);
  }
  else {
    if (*(int *)(kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x2c) * 4) != 10) goto LAB_001de6f9;
    lVar3 = *(long *)(this + 0x48);
    if (*(char *)(lVar3 + 0x28) == '\x01') {
      proto->type_ = 1;
      *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] & 0xf7;
    }
  }
  if (*(char *)(lVar3 + 0x29) == '\0') {
    FieldDescriptorProto::set_type_name(proto,".");
  }
  psVar2 = FieldDescriptorProto::mutable_type_name_abi_cxx11_(proto);
  std::__cxx11::string::append((string *)psVar2);
LAB_001de6f9:
  if (this[0x68] == (FieldDescriptor)0x1) {
    DefaultValueAsString_abi_cxx11_(&sStack_38,this,false);
    FieldDescriptorProto::set_default_value(proto,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  pFVar5 = *(FieldOptions **)(this + 0x60);
  pFVar4 = FieldOptions::default_instance();
  if (pFVar5 != pFVar4) {
    pFVar5 = FieldDescriptorProto::mutable_options(proto);
    FieldOptions::CopyFrom(pFVar5,*(FieldOptions **)(this + 0x60));
  }
  return;
}

Assistant:

void FieldDescriptor::CopyTo(FieldDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  proto->set_label(static_cast<FieldDescriptorProto::Label>(
                     implicit_cast<int>(label())));
  proto->set_type(static_cast<FieldDescriptorProto::Type>(
                    implicit_cast<int>(type())));

  if (is_extension()) {
    if (!containing_type()->is_unqualified_placeholder_) {
      proto->set_extendee(".");
    }
    proto->mutable_extendee()->append(containing_type()->full_name());
  }

  if (cpp_type() == CPPTYPE_MESSAGE) {
    if (message_type()->is_placeholder_) {
      // We don't actually know if the type is a message type.  It could be
      // an enum.
      proto->clear_type();
    }

    if (!message_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(message_type()->full_name());
  } else if (cpp_type() == CPPTYPE_ENUM) {
    if (!enum_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(enum_type()->full_name());
  }

  if (has_default_value()) {
    proto->set_default_value(DefaultValueAsString(false));
  }

  if (&options() != &FieldOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}